

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::AddNodePrefixes(aiNode *node,char *prefix,uint len)

{
  uint i;
  ulong uVar1;
  
  PrefixString(&node->mName,prefix,len);
  for (uVar1 = 0; uVar1 < node->mNumChildren; uVar1 = uVar1 + 1) {
    AddNodePrefixes(node->mChildren[uVar1],prefix,len);
  }
  return;
}

Assistant:

void SceneCombiner::AddNodePrefixes(aiNode* node, const char* prefix, unsigned int len) {
    ai_assert(NULL != prefix);
    PrefixString(node->mName,prefix,len);

    // Process all children recursively
    for ( unsigned int i = 0; i < node->mNumChildren; ++i ) {
        AddNodePrefixes( node->mChildren[ i ], prefix, len );
    }
}